

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O3

int Cec_GiaSplitTest(Gia_Man_t *p,int nProcs,int nTimeOut,int nIterMax,int LookAhead,int fVerbose,
                    int fVeryVerbose,int fSilent)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  Gia_Man_t *p_00;
  uint uVar4;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  ulong uVar7;
  int local_58;
  Abc_Cex_t *local_40;
  
  Abc_CexFreeP(&p->pCexComb);
  pVVar5 = p->vCos;
  uVar6 = (ulong)(uint)pVVar5->nSize;
  uVar4 = 1;
  if (p->nRegs < pVVar5->nSize) {
    local_58 = -1;
    bVar2 = 0;
    local_40 = (Abc_Cex_t *)0x0;
    uVar7 = 0;
    do {
      if ((long)(int)uVar6 <= (long)uVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((pVVar5->pArray[uVar7] < 0) || (p->nObjs <= pVVar5->pArray[uVar7])) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar1 = uVar7 + 1;
      p_00 = Gia_ManDupOutputGroup(p,(int)uVar7,(int)uVar1);
      if (fVerbose == 0) {
        iVar3 = 0;
      }
      else {
        printf("\nSolving output %d:\n",uVar7 & 0xffffffff);
        iVar3 = fVerbose;
      }
      iVar3 = Cec_GiaSplitTestInt(p_00,nProcs,nTimeOut,nIterMax,LookAhead,iVar3,fVeryVerbose,fSilent
                                 );
      Gia_ManStop(p_00);
      if (local_58 == -1 && iVar3 == 0) {
        local_40 = p_00->pCexComb;
        p_00->pCexComb = (Abc_Cex_t *)0x0;
        local_40->iPo = (int)uVar7;
        local_58 = 0;
      }
      if (iVar3 == -1) {
        bVar2 = 1;
      }
      pVVar5 = p->vCos;
      uVar6 = (ulong)pVVar5->nSize;
      uVar7 = uVar1;
    } while ((long)uVar1 < (long)(uVar6 - (long)p->nRegs));
    uVar4 = 0;
    if (local_58 == -1) {
      uVar4 = -(uint)bVar2 | 1;
    }
    else {
      p->pCexComb = local_40;
    }
  }
  return uVar4;
}

Assistant:

int Cec_GiaSplitTest( Gia_Man_t * p, int nProcs, int nTimeOut, int nIterMax, int LookAhead, int fVerbose, int fVeryVerbose, int fSilent )
{
    Abc_Cex_t * pCex = NULL;
    Gia_Man_t * pOne;
    Gia_Obj_t * pObj;
    int i, RetValue1, fOneUndef = 0, RetValue = -1;
    Abc_CexFreeP( &p->pCexComb );
    Gia_ManForEachPo( p, pObj, i )
    {
        pOne = Gia_ManDupOutputGroup( p, i, i+1 );
        if ( fVerbose )
            printf( "\nSolving output %d:\n", i );
        RetValue1 = Cec_GiaSplitTestInt( pOne, nProcs, nTimeOut, nIterMax, LookAhead,  fVerbose, fVeryVerbose, fSilent );
        Gia_ManStop( pOne );
        // collect the result
        if ( RetValue1 == 0 && RetValue == -1 )
        {
            pCex = pOne->pCexComb; pOne->pCexComb = NULL;
            pCex->iPo = i;
            RetValue = 0;
        }
        if ( RetValue1 == -1 )
            fOneUndef = 1;
    }
    if ( RetValue == -1 )
        RetValue = fOneUndef ? -1 : 1;
    else
        p->pCexComb = pCex;
    return RetValue;
}